

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString *
icu_63::operator+(UnicodeString *__return_storage_ptr__,UnicodeString *s1,UnicodeString *s2)

{
  short sVar1;
  int iVar2;
  UnicodeString *pUVar3;
  int iVar4;
  UnicodeString local_60;
  
  sVar1 = (s1->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s1->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (s2->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  UnicodeString::UnicodeString(&local_60,iVar2 + iVar4 + 1,0,0);
  pUVar3 = UnicodeString::append(&local_60,s1);
  pUVar3 = UnicodeString::append(pUVar3,s2);
  UnicodeString::UnicodeString(__return_storage_ptr__,pUVar3);
  UnicodeString::~UnicodeString(&local_60);
  return __return_storage_ptr__;
}

Assistant:

U_EXPORT2
operator+ (const UnicodeString &s1, const UnicodeString &s2) {
    return
        UnicodeString(s1.length()+s2.length()+1, (UChar32)0, 0).
            append(s1).
                append(s2);
}